

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_metal_shards(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  const_reference pvVar5;
  long in_RCX;
  CHAR_DATA *in_RDX;
  int i;
  int dam;
  int number;
  OBJ_DATA *weapon;
  CHAR_DATA *victim;
  undefined1 in_stack_00001312;
  undefined1 in_stack_00001313;
  int in_stack_00001314;
  int in_stack_00001318;
  int in_stack_0000131c;
  CHAR_DATA *in_stack_00001320;
  CHAR_DATA *in_stack_00001328;
  int in_stack_00001348;
  int in_stack_00001350;
  char *in_stack_00001358;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  
  pOVar4 = get_eq_char(in_RDX,0x10);
  if (pOVar4 == (OBJ_DATA *)0x0) {
    send_to_char(in_stack_ffffffffffffffb0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    bVar1 = is_metal((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (bVar1) {
      iVar2 = number_range(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      if (iVar2 < 1) {
        iVar2 = 1;
      }
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
        iVar3 = dice(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        bVar1 = str_cmp(pOVar4->material,"iron");
        if (bVar1) {
LAB_006e6f77:
          bVar1 = str_cmp(pOVar4->material,"mithril");
          if (!bVar1) {
            pvVar5 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                               (&race_table,(long)*(short *)(in_RCX + 0x136));
            bVar1 = str_cmp(pvVar5->name,"drow");
            if (!bVar1) goto LAB_006e6fbf;
          }
        }
        else {
          pvVar5 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                             (&race_table,(long)*(short *)(in_RCX + 0x136));
          bVar1 = str_cmp(pvVar5->name,"elf");
          if (bVar1) goto LAB_006e6f77;
LAB_006e6fbf:
          iVar3 = (int)((float)iVar3 * 1.33);
        }
        in_stack_ffffffffffffffa0 = 0;
        damage_new(in_stack_00001328,in_stack_00001320,in_stack_0000131c,in_stack_00001318,
                   in_stack_00001314,(bool)in_stack_00001313,(bool)in_stack_00001312,
                   in_stack_00001348,in_stack_00001350,in_stack_00001358);
        bVar1 = is_safe_new((CHAR_DATA *)CONCAT44(iVar2,iVar3),
                            (CHAR_DATA *)CONCAT44(iVar6,in_stack_ffffffffffffffc0),
                            (bool)in_stack_ffffffffffffffbf);
        if (bVar1) {
          return;
        }
        if (in_RDX->in_room != *(ROOM_INDEX_DATA **)(in_RCX + 0xa8)) {
          return;
        }
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffffb0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  return;
}

Assistant:

void spell_metal_shards(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *weapon;
	int number, dam, i;

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon == nullptr)
	{
		send_to_char("You must be wielding a weapon to cast this spell.\n\r", ch);
		return;
	}

	if (!is_metal(weapon))
	{
		send_to_char("You are not wielding a metallic weapon!\n\r", ch);
		return;
	}

	number = number_range(level / 10 - 1, level / 10 + 1);

	if (number <= 0)
		number = 1;

	act("You wave your $p in a broad arc, sending a hail of razor-sharp metal at $N!", ch, weapon, victim, TO_CHAR);
	act("$n waves $p in a broad arc, sending a hail of razor-sharp metal at you!", ch, weapon, victim, TO_VICT);
	act("$n waves $p in a broad arc, sending a hail of razor-sharp metal at $N!", ch, weapon, victim, TO_NOTVICT);

	for (i = 0; i < number; i++)
	{
		dam = dice(1 + level / 10, 9);

		if ((!str_cmp(weapon->material, "iron") && !str_cmp(race_table[victim->race].name, "elf"))
			|| (!str_cmp(weapon->material, "mithril") && !str_cmp(race_table[victim->race].name, "drow")))
		{
			dam = (int)((float)dam * 1.33);
		}

		damage_new(ch, victim, dam, sn, DAM_PIERCE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "metal shard");

		if (is_safe_new(ch, victim, false))
			return;

		if (ch->in_room != victim->in_room)
			return;
	}
}